

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2closest_edge_query_base.h
# Opt level: O0

void __thiscall
S2ClosestEdgeQueryBase<S2MinDistance>::FindClosestEdges
          (S2ClosestEdgeQueryBase<S2MinDistance> *this,Target *target,Options *options,
          vector<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>_>
          *results)

{
  int iVar1;
  int32 iVar2;
  iterator iVar3;
  iterator iVar4;
  back_insert_iterator<std::vector<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>_>_>
  __result;
  btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>,_S2ClosestEdgeQueryBase<S2MinDistance>::Result_&,_S2ClosestEdgeQueryBase<S2MinDistance>::Result_*>
  __first;
  iterator iVar5;
  iterator iVar6;
  btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>,_S2ClosestEdgeQueryBase<S2MinDistance>::Result_&,_S2ClosestEdgeQueryBase<S2MinDistance>::Result_*>
  __last;
  vector<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>_>
  *results_local;
  Options *options_local;
  Target *target_local;
  S2ClosestEdgeQueryBase<S2MinDistance> *this_local;
  
  FindClosestEdgesInternal(this,target,options);
  std::
  vector<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>_>
  ::clear(results);
  iVar1 = Options::max_results(options);
  if (iVar1 == 1) {
    iVar2 = Result::shape_id(&this->result_singleton_);
    if (-1 < iVar2) {
      std::
      vector<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>_>
      ::push_back(results,&this->result_singleton_);
    }
  }
  else {
    iVar1 = Options::max_results(options);
    if (iVar1 == 0x7fffffff) {
      iVar3 = std::
              vector<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>_>
              ::begin(&this->result_vector_);
      iVar4 = std::
              vector<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>_>
              ::end(&this->result_vector_);
      std::
      sort<__gnu_cxx::__normal_iterator<S2ClosestEdgeQueryBase<S2MinDistance>::Result*,std::vector<S2ClosestEdgeQueryBase<S2MinDistance>::Result,std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>>>>
                ((__normal_iterator<S2ClosestEdgeQueryBase<S2MinDistance>::Result_*,_std::vector<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>_>_>
                  )iVar3._M_current,
                 (__normal_iterator<S2ClosestEdgeQueryBase<S2MinDistance>::Result_*,_std::vector<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>_>_>
                  )iVar4._M_current);
      iVar3 = std::
              vector<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>_>
              ::begin(&this->result_vector_);
      iVar4 = std::
              vector<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>_>
              ::end(&this->result_vector_);
      __result = std::
                 back_inserter<std::vector<S2ClosestEdgeQueryBase<S2MinDistance>::Result,std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>>>
                           (results);
      std::
      unique_copy<__gnu_cxx::__normal_iterator<S2ClosestEdgeQueryBase<S2MinDistance>::Result*,std::vector<S2ClosestEdgeQueryBase<S2MinDistance>::Result,std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>>>,std::back_insert_iterator<std::vector<S2ClosestEdgeQueryBase<S2MinDistance>::Result,std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>>>>
                ((__normal_iterator<S2ClosestEdgeQueryBase<S2MinDistance>::Result_*,_std::vector<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>_>_>
                  )iVar3._M_current,
                 (__normal_iterator<S2ClosestEdgeQueryBase<S2MinDistance>::Result_*,_std::vector<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>_>_>
                  )iVar4._M_current,__result);
      std::
      vector<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>_>
      ::clear(&this->result_vector_);
    }
    else {
      iVar5 = gtl::internal_btree::
              btree_container<gtl::internal_btree::btree<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>_>
              ::begin((btree_container<gtl::internal_btree::btree<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>_>
                       *)&this->result_set_);
      iVar6 = gtl::internal_btree::
              btree_container<gtl::internal_btree::btree<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>_>
              ::end((btree_container<gtl::internal_btree::btree<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>_>
                     *)&this->result_set_);
      __first._12_4_ = 0;
      __first.node = (btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>
                      *)SUB128(iVar5._0_12_,0);
      __first.position = SUB124(iVar5._0_12_,8);
      __last._12_4_ = 0;
      __last.node = (btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>
                     *)SUB128(iVar6._0_12_,0);
      __last.position = SUB124(iVar6._0_12_,8);
      std::
      vector<S2ClosestEdgeQueryBase<S2MinDistance>::Result,std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>>
      ::
      assign<gtl::internal_btree::btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,256,false>>,S2ClosestEdgeQueryBase<S2MinDistance>::Result&,S2ClosestEdgeQueryBase<S2MinDistance>::Result*>,void>
                ((vector<S2ClosestEdgeQueryBase<S2MinDistance>::Result,std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>>
                  *)results,__first,__last);
      gtl::internal_btree::
      btree_container<gtl::internal_btree::btree<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>_>
      ::clear((btree_container<gtl::internal_btree::btree<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>_>
               *)&this->result_set_);
    }
  }
  return;
}

Assistant:

void S2ClosestEdgeQueryBase<Distance>::FindClosestEdges(
    Target* target, const Options& options,
    std::vector<Result>* results) {
  FindClosestEdgesInternal(target, options);
  results->clear();
  if (options.max_results() == 1) {
    if (result_singleton_.shape_id() >= 0) {
      results->push_back(result_singleton_);
    }
  } else if (options.max_results() == Options::kMaxMaxResults) {
    std::sort(result_vector_.begin(), result_vector_.end());
    std::unique_copy(result_vector_.begin(), result_vector_.end(),
                     std::back_inserter(*results));
    result_vector_.clear();
  } else {
    results->assign(result_set_.begin(), result_set_.end());
    result_set_.clear();
  }
}